

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

ProcessInfo
llvm::sys::ExecuteNoWait
          (StringRef Program,ArrayRef<llvm::StringRef> Args,
          Optional<llvm::ArrayRef<llvm::StringRef>_> Env,
          ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects,uint MemoryLimit,string *ErrMsg,
          bool *ExecutionFailed)

{
  ArrayRef<llvm::StringRef> Args_00;
  bool bVar1;
  size_type sVar2;
  ProcessInfo PI;
  ProcessInfo local_60;
  StringRef *local_50;
  size_type local_48;
  Optional<llvm::StringRef> *local_40;
  size_type sStack_38;
  
  sVar2 = Redirects.Length;
  local_48 = Args.Length;
  local_50 = Args.Data;
  if ((sVar2 != 0) && (sVar2 != 3)) {
    __assert_fail("Redirects.empty() || Redirects.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Program.cpp"
                  ,0x39,
                  "ProcessInfo llvm::sys::ExecuteNoWait(StringRef, ArrayRef<StringRef>, Optional<ArrayRef<StringRef>>, ArrayRef<Optional<StringRef>>, unsigned int, std::string *, bool *)"
                 );
  }
  ProcessInfo::ProcessInfo(&local_60);
  if (ExecutionFailed != (bool *)0x0) {
    *ExecutionFailed = false;
  }
  Args_00.Length = local_48;
  Args_00.Data = local_50;
  local_40 = Redirects.Data;
  sStack_38 = sVar2;
  bVar1 = Execute(&local_60,Program,Args_00,Env,Redirects,MemoryLimit,ErrMsg);
  if ((ExecutionFailed != (bool *)0x0) && (!bVar1)) {
    *ExecutionFailed = true;
  }
  return local_60;
}

Assistant:

ProcessInfo sys::ExecuteNoWait(StringRef Program, ArrayRef<StringRef> Args,
                               Optional<ArrayRef<StringRef>> Env,
                               ArrayRef<Optional<StringRef>> Redirects,
                               unsigned MemoryLimit, std::string *ErrMsg,
                               bool *ExecutionFailed) {
  assert(Redirects.empty() || Redirects.size() == 3);
  ProcessInfo PI;
  if (ExecutionFailed)
    *ExecutionFailed = false;
  if (!Execute(PI, Program, Args, Env, Redirects, MemoryLimit, ErrMsg))
    if (ExecutionFailed)
      *ExecutionFailed = true;

  return PI;
}